

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O0

void __thiscall CCIT<TTA>::PerformLabeling(CCIT<TTA> *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uchar *puVar9;
  uint *puVar10;
  uint uVar11;
  bool bVar12;
  int iLabel_3;
  int iLabel_2;
  int c_1;
  uint *img_labels_row_3;
  uchar *img_row_3;
  int iLabel_1;
  int iLabel;
  int c;
  uint *img_labels_row_fol;
  uint *img_labels_row_2;
  uchar *img_row_fol_2;
  uchar *img_row_2;
  int r;
  bool o_cols;
  int e_cols;
  int iStack_fc;
  bool o_rows;
  int e_rows;
  int x_1;
  uint *img_labels_row_prev_prev;
  uint *img_labels_row_1;
  uchar *img_row_fol_1;
  uchar *img_row_prev;
  uchar *img_row_1;
  int y_1;
  int x;
  uint *img_labels_row;
  uchar *img_row_fol;
  uchar *img_row;
  int y;
  bool nextprocedure2;
  int k;
  int v;
  int u;
  int lx;
  int h;
  int w;
  int local_7c;
  Size local_78;
  Mat_<int> local_70;
  CCIT<TTA> *local_10;
  CCIT<TTA> *this_local;
  
  local_10 = this;
  cv::MatSize::operator()((MatSize *)&local_78);
  local_7c = 0;
  cv::Mat_<int>::Mat_(&local_70,&local_78,&local_7c);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_70)
  ;
  cv::Mat_<int>::~Mat_(&local_70);
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0xc;
  iVar2 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8;
  TTA::Alloc(((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8 + 1) /
             2) * ((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc +
                   1) / 2) + 1);
  TTA::Setup();
  puVar9 = cv::Mat::ptr<unsigned_char>
                     (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
  lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
  puVar10 = cv::Mat::ptr<unsigned_int>
                      (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                       0);
  for (img_row_1._4_4_ = 0; img_row_1._4_4_ < iVar1; img_row_1._4_4_ = img_row_1._4_4_ + 2) {
    if (puVar9[img_row_1._4_4_] == '\0') {
      if ((img_row_1._4_4_ + 1 < iVar1) && (puVar9[img_row_1._4_4_ + 1] != '\0')) {
        v = TTA::NewLabel();
        puVar10[img_row_1._4_4_] = v;
        bVar12 = true;
      }
      else if ((iVar2 < 2) || (puVar9[img_row_1._4_4_ + lVar3] == '\0')) {
        if (((img_row_1._4_4_ + 1 < iVar1) && (1 < iVar2)) &&
           (puVar9[(img_row_1._4_4_ + 1) + lVar3] != '\0')) {
          v = TTA::NewLabel();
          puVar10[img_row_1._4_4_] = v;
          bVar12 = true;
        }
        else {
          bVar12 = false;
        }
      }
      else {
        v = TTA::NewLabel();
        puVar10[img_row_1._4_4_] = v;
        if (((img_row_1._4_4_ + 1 < iVar1) && (1 < iVar2)) &&
           (puVar9[(img_row_1._4_4_ + 1) + lVar3] != '\0')) {
          bVar12 = true;
        }
        else {
          bVar12 = false;
        }
      }
    }
    else {
      v = TTA::NewLabel();
      puVar10[img_row_1._4_4_] = v;
      if (((img_row_1._4_4_ + 1 < iVar1) && (puVar9[img_row_1._4_4_ + 1] != '\0')) ||
         ((img_row_1._4_4_ + 1 < iVar1 &&
          ((1 < iVar2 && (puVar9[(img_row_1._4_4_ + 1) + lVar3] != '\0')))))) {
        bVar12 = true;
      }
      else {
        bVar12 = false;
      }
    }
    while (bVar12 && img_row_1._4_4_ + 2 < iVar1) {
      iVar6 = img_row_1._4_4_ + 2;
      if (puVar9[iVar6] == '\0') {
        if ((img_row_1._4_4_ + 3 < iVar1) && (puVar9[img_row_1._4_4_ + 3] != '\0')) {
          if ((iVar2 < 2) || (puVar9[iVar6 + lVar3] == '\0')) {
            v = TTA::NewLabel();
            puVar10[iVar6] = v;
          }
          else {
            puVar10[iVar6] = v;
          }
          bVar12 = true;
          img_row_1._4_4_ = iVar6;
        }
        else if ((iVar2 < 2) || (puVar9[iVar6 + lVar3] == '\0')) {
          if (((img_row_1._4_4_ + 3 < iVar1) && (1 < iVar2)) &&
             (puVar9[(img_row_1._4_4_ + 3) + lVar3] != '\0')) {
            v = TTA::NewLabel();
            puVar10[iVar6] = v;
            bVar12 = true;
            img_row_1._4_4_ = iVar6;
          }
          else {
            bVar12 = false;
            img_row_1._4_4_ = iVar6;
          }
        }
        else {
          puVar10[iVar6] = v;
          if (((img_row_1._4_4_ + 3 < iVar1) && (1 < iVar2)) &&
             (puVar9[(img_row_1._4_4_ + 3) + lVar3] != '\0')) {
            bVar12 = true;
            img_row_1._4_4_ = iVar6;
          }
          else {
            bVar12 = false;
            img_row_1._4_4_ = iVar6;
          }
        }
      }
      else {
        puVar10[iVar6] = v;
        if (((img_row_1._4_4_ + 3 < iVar1) && (puVar9[img_row_1._4_4_ + 3] != '\0')) ||
           ((img_row_1._4_4_ + 3 < iVar1 &&
            ((1 < iVar2 && (puVar9[(img_row_1._4_4_ + 3) + lVar3] != '\0')))))) {
          bVar12 = true;
          img_row_1._4_4_ = iVar6;
        }
        else {
          bVar12 = false;
          img_row_1._4_4_ = iVar6;
        }
      }
    }
  }
  for (img_row_1._0_4_ = 2; (int)img_row_1 < iVar2; img_row_1._0_4_ = (int)img_row_1 + 2) {
    puVar9 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row_1);
    lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    lVar4 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar10 = cv::Mat::ptr<unsigned_int>
                        (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,(int)img_row_1);
    lVar5 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                         field_0x48 -
            **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    for (iStack_fc = 0; iStack_fc < iVar1; iStack_fc = iStack_fc + 2) {
      if (puVar9[iStack_fc] == '\0') {
        if ((iStack_fc + 1 < iVar1) && (puVar9[iStack_fc + 1] != '\0')) {
          if ((iStack_fc + 1 < iVar1) && (puVar9[(iStack_fc + 1) - lVar3] != '\0')) {
            v = *(uint *)((long)puVar10 + (long)iStack_fc * 4 + lVar5);
            puVar10[iStack_fc] = v;
          }
          else if (puVar9[iStack_fc - lVar3] == '\0') {
            if ((iStack_fc + 2 < iVar1) && (puVar9[(iStack_fc + 2) - lVar3] != '\0')) {
              v = *(uint *)((long)puVar10 + (long)(iStack_fc + 2) * 4 + lVar5);
              puVar10[iStack_fc] = v;
            }
            else {
              v = TTA::NewLabel();
              puVar10[iStack_fc] = v;
            }
          }
          else {
            v = *(uint *)((long)puVar10 + (long)iStack_fc * 4 + lVar5);
            puVar10[iStack_fc] = v;
            if ((iStack_fc + 2 < iVar1) && (puVar9[(iStack_fc + 2) - lVar3] != '\0')) {
              TTA::Merge(v,*(uint *)((long)puVar10 + (long)(iStack_fc + 2) * 4 + lVar5));
            }
          }
          bVar12 = true;
        }
        else if (((int)img_row_1 + 1 < iVar2) && (puVar9[iStack_fc + lVar4] != '\0')) {
          v = TTA::NewLabel();
          puVar10[iStack_fc] = v;
          if (((iStack_fc + 1 < iVar1) && ((int)img_row_1 + 1 < iVar2)) &&
             (puVar9[(iStack_fc + 1) + lVar4] != '\0')) {
            bVar12 = true;
          }
          else {
            bVar12 = false;
          }
        }
        else if (((iStack_fc + 1 < iVar1) && ((int)img_row_1 + 1 < iVar2)) &&
                (puVar9[(iStack_fc + 1) + lVar4] != '\0')) {
          v = TTA::NewLabel();
          puVar10[iStack_fc] = v;
          bVar12 = true;
        }
        else {
          bVar12 = false;
        }
      }
      else if ((iStack_fc + 1 < iVar1) && (puVar9[iStack_fc + 1] != '\0')) {
        if (puVar9[iStack_fc - lVar3] == '\0') {
          if ((iStack_fc + 1 < iVar1) && (puVar9[(iStack_fc + 1) - lVar3] != '\0')) {
            v = *(uint *)((long)puVar10 + (long)iStack_fc * 4 + lVar5);
            puVar10[iStack_fc] = v;
            if ((0 < iStack_fc + -1) && (puVar9[(iStack_fc + -1) - lVar3] != '\0')) {
              TTA::Merge(v,*(uint *)((long)puVar10 + (long)(iStack_fc + -2) * 4 + lVar5));
            }
          }
          else if ((iStack_fc + -1 < 1) || (puVar9[(iStack_fc + -1) - lVar3] == '\0')) {
            if ((iStack_fc + 2 < iVar1) && (puVar9[(iStack_fc + 2) - lVar3] != '\0')) {
              v = *(uint *)((long)puVar10 + (long)(iStack_fc + 2) * 4 + lVar5);
              puVar10[iStack_fc] = v;
            }
            else {
              v = TTA::NewLabel();
              puVar10[iStack_fc] = v;
            }
          }
          else {
            v = *(uint *)((long)puVar10 + (long)(iStack_fc + -2) * 4 + lVar5);
            puVar10[iStack_fc] = v;
            if ((iStack_fc + 2 < iVar1) && (puVar9[(iStack_fc + 2) - lVar3] != '\0')) {
              TTA::Merge(v,*(uint *)((long)puVar10 + (long)(iStack_fc + 2) * 4 + lVar5));
            }
          }
        }
        else {
          v = *(uint *)((long)puVar10 + (long)iStack_fc * 4 + lVar5);
          puVar10[iStack_fc] = v;
          if ((((iVar1 <= iStack_fc + 1) || (puVar9[(iStack_fc + 1) - lVar3] == '\0')) &&
              (iStack_fc + 2 < iVar1)) && (puVar9[(iStack_fc + 2) - lVar3] != '\0')) {
            TTA::Merge(v,*(uint *)((long)puVar10 + (long)(iStack_fc + 2) * 4 + lVar5));
          }
        }
        bVar12 = true;
      }
      else {
        if (puVar9[iStack_fc - lVar3] == '\0') {
          if ((iStack_fc + -1 < 1) || (puVar9[(iStack_fc + -1) - lVar3] == '\0')) {
            if ((iStack_fc + 1 < iVar1) && (puVar9[(iStack_fc + 1) - lVar3] != '\0')) {
              v = *(uint *)((long)puVar10 + (long)iStack_fc * 4 + lVar5);
              puVar10[iStack_fc] = v;
            }
            else {
              v = TTA::NewLabel();
              puVar10[iStack_fc] = v;
            }
          }
          else {
            v = *(uint *)((long)puVar10 + (long)(iStack_fc + -2) * 4 + lVar5);
            puVar10[iStack_fc] = v;
            if ((iStack_fc + 1 < iVar1) && (puVar9[(iStack_fc + 1) - lVar3] != '\0')) {
              TTA::Merge(v,*(uint *)((long)puVar10 + (long)iStack_fc * 4 + lVar5));
            }
          }
        }
        else {
          v = *(uint *)((long)puVar10 + (long)iStack_fc * 4 + lVar5);
          puVar10[iStack_fc] = v;
        }
        if (((iStack_fc + 1 < iVar1) && ((int)img_row_1 + 1 < iVar2)) &&
           (puVar9[(iStack_fc + 1) + lVar4] != '\0')) {
          bVar12 = true;
        }
        else {
          bVar12 = false;
        }
      }
      while (bVar12 && iStack_fc + 2 < iVar1) {
        iVar6 = iStack_fc + 2;
        if (puVar9[iVar6] == '\0') {
          if ((iStack_fc + 3 < iVar1) && (puVar9[iStack_fc + 3] != '\0')) {
            if (((int)img_row_1 + 1 < iVar2) && (puVar9[iVar6 + lVar4] != '\0')) {
              puVar10[iVar6] = v;
              if ((iStack_fc + 3 < iVar1) && (puVar9[(iStack_fc + 3) - lVar3] != '\0')) {
                TTA::Merge(v,*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5));
              }
              else if (puVar9[iVar6 - lVar3] != '\0') {
                if ((iStack_fc + 4 < iVar1) && (puVar9[(iStack_fc + 4) - lVar3] != '\0')) {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                     *(uint *)((long)puVar10 + (long)(iStack_fc + 4) * 4 + lVar5));
                  TTA::Merge(v,uVar7);
                }
                else {
                  TTA::Merge(v,*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5));
                }
              }
              if ((iStack_fc + 4 < iVar1) && (puVar9[(iStack_fc + 4) - lVar3] != '\0')) {
                TTA::Merge(v,*(uint *)((long)puVar10 + (long)(iStack_fc + 4) * 4 + lVar5));
              }
            }
            else if ((iStack_fc + 3 < iVar1) && (puVar9[(iStack_fc + 3) - lVar3] != '\0')) {
              v = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
              puVar10[iVar6] = v;
            }
            else if (puVar9[iVar6 - lVar3] == '\0') {
              if ((iStack_fc + 4 < iVar1) && (puVar9[(iStack_fc + 4) - lVar3] != '\0')) {
                v = *(uint *)((long)puVar10 + (long)(iStack_fc + 4) * 4 + lVar5);
                puVar10[iVar6] = v;
              }
              else {
                v = TTA::NewLabel();
                puVar10[iVar6] = v;
              }
            }
            else {
              v = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
              puVar10[iVar6] = v;
              if ((iStack_fc + 4 < iVar1) && (puVar9[(iStack_fc + 4) - lVar3] != '\0')) {
                TTA::Merge(v,*(uint *)((long)puVar10 + (long)(iStack_fc + 4) * 4 + lVar5));
              }
            }
            bVar12 = true;
            iStack_fc = iVar6;
          }
          else if (((int)img_row_1 + 1 < iVar2) && (puVar9[iVar6 + lVar4] != '\0')) {
            puVar10[iVar6] = v;
            if (((iStack_fc + 3 < iVar1) && ((int)img_row_1 + 1 < iVar2)) &&
               (puVar9[(iStack_fc + 3) + lVar4] != '\0')) {
              bVar12 = true;
              iStack_fc = iVar6;
            }
            else {
              bVar12 = false;
              iStack_fc = iVar6;
            }
          }
          else if (((iStack_fc + 3 < iVar1) && ((int)img_row_1 + 1 < iVar2)) &&
                  (puVar9[(iStack_fc + 3) + lVar4] != '\0')) {
            v = TTA::NewLabel();
            puVar10[iVar6] = v;
            bVar12 = true;
            iStack_fc = iVar6;
          }
          else {
            bVar12 = false;
            iStack_fc = iVar6;
          }
        }
        else {
          puVar10[iVar6] = v;
          if ((iStack_fc + 3 < iVar1) && (puVar9[iStack_fc + 3] != '\0')) {
            if (puVar9[iVar6 - lVar3] == '\0') {
              if ((iStack_fc + 3 < iVar1) && (puVar9[(iStack_fc + 3) - lVar3] != '\0')) {
                if ((iStack_fc + 1 < 1) || (puVar9[(iStack_fc + 1) - lVar3] == '\0')) {
                  TTA::Merge(v,*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5));
                }
                else {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)iStack_fc * 4 + lVar5),
                                     *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5));
                  TTA::Merge(v,uVar7);
                }
              }
              else if ((iStack_fc + 1 < 1) || (puVar9[(iStack_fc + 1) - lVar3] == '\0')) {
                if ((iStack_fc + 4 < iVar1) && (puVar9[(iStack_fc + 4) - lVar3] != '\0')) {
                  TTA::Merge(v,*(uint *)((long)puVar10 + (long)(iStack_fc + 4) * 4 + lVar5));
                }
              }
              else if ((iStack_fc + 4 < iVar1) && (puVar9[(iStack_fc + 4) - lVar3] != '\0')) {
                uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)iStack_fc * 4 + lVar5),
                                   *(uint *)((long)puVar10 + (long)(iStack_fc + 4) * 4 + lVar5));
                TTA::Merge(v,uVar7);
              }
              else {
                TTA::Merge(v,*(uint *)((long)puVar10 + (long)iStack_fc * 4 + lVar5));
              }
            }
            else if ((iStack_fc + 3 < iVar1) && (puVar9[(iStack_fc + 3) - lVar3] != '\0')) {
              TTA::Merge(v,*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5));
            }
            else if ((iStack_fc + 4 < iVar1) && (puVar9[(iStack_fc + 4) - lVar3] != '\0')) {
              uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                 *(uint *)((long)puVar10 + (long)(iStack_fc + 4) * 4 + lVar5));
              TTA::Merge(v,uVar7);
            }
            else {
              TTA::Merge(v,*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5));
            }
            bVar12 = true;
            iStack_fc = iVar6;
          }
          else {
            puVar10[iVar6] = v;
            if (puVar9[iVar6 - lVar3] == '\0') {
              if ((iStack_fc + 1 < 1) || (puVar9[(iStack_fc + 1) - lVar3] == '\0')) {
                if ((iStack_fc + 3 < iVar1) && (puVar9[(iStack_fc + 3) - lVar3] != '\0')) {
                  TTA::Merge(v,*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5));
                }
              }
              else if ((iStack_fc + 3 < iVar1) && (puVar9[(iStack_fc + 3) - lVar3] != '\0')) {
                uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)iStack_fc * 4 + lVar5),
                                   *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5));
                TTA::Merge(v,uVar7);
              }
              else {
                TTA::Merge(v,*(uint *)((long)puVar10 + (long)iStack_fc * 4 + lVar5));
              }
            }
            else {
              TTA::Merge(v,*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5));
            }
            if (((iStack_fc + 3 < iVar1) && ((int)img_row_1 + 1 < iVar2)) &&
               (puVar9[(iStack_fc + 3) + lVar4] != '\0')) {
              bVar12 = true;
              iStack_fc = iVar6;
            }
            else {
              bVar12 = false;
              iStack_fc = iVar6;
            }
          }
        }
      }
    }
  }
  uVar7 = TTA::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar7;
  uVar7 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8;
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8;
  uVar11 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0xc &
           0xfffffffe;
  bVar12 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0xc % 2
           == 1;
  for (img_row_2._0_4_ = 0; (int)img_row_2 < (int)(uVar7 & 0xfffffffe);
      img_row_2._0_4_ = (int)img_row_2 + 2) {
    puVar9 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row_2);
    lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar10 = cv::Mat::ptr<unsigned_int>
                        (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,(int)img_row_2);
    lVar4 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    for (iLabel_1 = 0; iLabel_1 < (int)uVar11; iLabel_1 = iLabel_1 + 2) {
      if ((int)puVar10[iLabel_1] < 1) {
        puVar10[iLabel_1] = 0;
        puVar10[iLabel_1 + 1] = 0;
        *(undefined4 *)((long)puVar10 + (long)iLabel_1 * 4 + lVar4) = 0;
        *(undefined4 *)((long)puVar10 + (long)(iLabel_1 + 1) * 4 + lVar4) = 0;
      }
      else {
        uVar8 = TTA::GetLabel(puVar10[iLabel_1]);
        if (puVar9[iLabel_1] == '\0') {
          puVar10[iLabel_1] = 0;
        }
        else {
          puVar10[iLabel_1] = uVar8;
        }
        if (puVar9[iLabel_1 + 1] == '\0') {
          puVar10[iLabel_1 + 1] = 0;
        }
        else {
          puVar10[iLabel_1 + 1] = uVar8;
        }
        if (puVar9[iLabel_1 + lVar3] == '\0') {
          *(undefined4 *)((long)puVar10 + (long)iLabel_1 * 4 + lVar4) = 0;
        }
        else {
          *(uint *)((long)puVar10 + (long)iLabel_1 * 4 + lVar4) = uVar8;
        }
        if (puVar9[(iLabel_1 + 1) + lVar3] == '\0') {
          *(undefined4 *)((long)puVar10 + (long)(iLabel_1 + 1) * 4 + lVar4) = 0;
        }
        else {
          *(uint *)((long)puVar10 + (long)(iLabel_1 + 1) * 4 + lVar4) = uVar8;
        }
      }
    }
    if (bVar12) {
      if ((int)puVar10[iLabel_1] < 1) {
        puVar10[iLabel_1] = 0;
        *(undefined4 *)((long)puVar10 + (long)iLabel_1 * 4 + lVar4) = 0;
      }
      else {
        uVar8 = TTA::GetLabel(puVar10[iLabel_1]);
        if (puVar9[iLabel_1] == '\0') {
          puVar10[iLabel_1] = 0;
        }
        else {
          puVar10[iLabel_1] = uVar8;
        }
        if (puVar9[iLabel_1 + lVar3] == '\0') {
          *(undefined4 *)((long)puVar10 + (long)iLabel_1 * 4 + lVar4) = 0;
        }
        else {
          *(uint *)((long)puVar10 + (long)iLabel_1 * 4 + lVar4) = uVar8;
        }
      }
    }
  }
  if (iVar1 % 2 == 1) {
    puVar9 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row_2);
    puVar10 = cv::Mat::ptr<unsigned_int>
                        (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,(int)img_row_2);
    for (iLabel_3 = 0; iLabel_3 < (int)uVar11; iLabel_3 = iLabel_3 + 2) {
      if ((int)puVar10[iLabel_3] < 1) {
        puVar10[iLabel_3] = 0;
        puVar10[iLabel_3 + 1] = 0;
      }
      else {
        uVar7 = TTA::GetLabel(puVar10[iLabel_3]);
        if (puVar9[iLabel_3] == '\0') {
          puVar10[iLabel_3] = 0;
        }
        else {
          puVar10[iLabel_3] = uVar7;
        }
        if (puVar9[iLabel_3 + 1] == '\0') {
          puVar10[iLabel_3 + 1] = 0;
        }
        else {
          puVar10[iLabel_3 + 1] = uVar7;
        }
      }
    }
    if (bVar12) {
      if ((int)puVar10[iLabel_3] < 1) {
        puVar10[iLabel_3] = 0;
      }
      else {
        uVar7 = TTA::GetLabel(puVar10[iLabel_3]);
        if (puVar9[iLabel_3] == '\0') {
          puVar10[iLabel_3] = 0;
        }
        else {
          puVar10[iLabel_3] = uVar7;
        }
      }
    }
  }
  TTA::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0);

        int w = img_labels_.cols;
        int h = img_labels_.rows;

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        int lx, u, v, k;

#define CONDITION_B1 img_row[x] > 0 
#define CONDITION_B2 x+1<w && img_row[x+1] > 0              // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img_row_fol[x] > 0            // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img_row_fol[x+1] > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img_row_prev[x-1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U2 img_row_prev[x] > 0
#define CONDITION_U3 x+1<w && img_row_prev[x+1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img_row_prev[x+2] > 0         // WRONG in the original code -> add missing condition
#define ASSIGN_S img_labels_row[x] = img_labels_row[x-2]
#define ASSIGN_P img_labels_row[x] = img_labels_row_prev_prev[x-2]
#define ASSIGN_Q img_labels_row[x] = img_labels_row_prev_prev[x]
#define ASSIGN_R img_labels_row[x] = img_labels_row_prev_prev[x+2]
#define ASSIGN_LX img_labels_row[x] = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels_row_prev_prev[x-2]
#define LOAD_PV v = img_labels_row_prev_prev[x-2]
#define LOAD_QU u = img_labels_row_prev_prev[x]
#define LOAD_QV v = img_labels_row_prev_prev[x]
#define LOAD_QK k = img_labels_row_prev_prev[x]
#define LOAD_RV v = img_labels_row_prev_prev[x+2]
#define LOAD_RK k = img_labels_row_prev_prev[x+2]
#define NEW_LABEL lx = img_labels_row[x] = LabelsSolver::NewLabel();
#define RESOLVE_2(u, v) LabelsSolver::Merge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::Merge(u,LabelsSolver::Merge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        const unsigned char* const img_row = img_.ptr<unsigned char>(y);
        const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
        unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);

        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

        // Second scan (changed with better performing strategy to handle odd rows and columns)
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }